

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgaussrule.cpp
# Opt level: O1

void __thiscall
TPZGaussRule::ComputingGaussJacobiQuadrature
          (TPZGaussRule *this,int *npoints,longdouble alpha,longdouble beta,
          TPZVec<long_double> *Location,TPZVec<long_double> *Weight)

{
  uint uVar1;
  double dVar2;
  _func_int **pp_Var3;
  ulong uVar4;
  longdouble *plVar5;
  ulong uVar6;
  int iVar7;
  longdouble *plVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  bool bVar14;
  longdouble in_ST0;
  longdouble lVar15;
  longdouble lVar16;
  longdouble lVar17;
  longdouble lVar18;
  longdouble lVar19;
  longdouble lVar20;
  longdouble lVar21;
  longdouble in_ST1;
  longdouble lVar22;
  longdouble lVar23;
  longdouble lVar24;
  longdouble in_ST2;
  longdouble lVar25;
  longdouble lVar26;
  longdouble in_ST3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  TPZVec<long_double> c;
  TPZVec<long_double> b;
  longdouble local_148;
  uint local_134;
  uint local_130;
  int local_12c;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  longdouble local_108;
  longdouble local_f8;
  longdouble local_e8;
  longdouble local_dc;
  TPZVec<long_double> *local_d0;
  TPZVec<long_double> *local_c8;
  TPZVec<long_double> local_c0;
  TPZVec<long_double> local_a0;
  _func_int **local_80;
  ulong local_78;
  longdouble local_6c;
  longdouble local_60;
  longdouble local_54;
  longdouble local_48;
  longdouble local_3c;
  
  local_a0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_a0.fStore = (longdouble *)0x0;
  local_a0.fNElements = 0;
  local_a0.fNAlloc = 0;
  local_c0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_c0.fStore = (longdouble *)0x0;
  local_c0.fNElements = 0;
  local_c0.fNAlloc = 0;
  local_148 = (longdouble)0;
  local_d0 = Location;
  (*Location->_vptr_TPZVec[2])(Location,(long)*npoints,&local_148);
  local_148 = (longdouble)0;
  (*Weight->_vptr_TPZVec[2])(Weight,(long)*npoints,&local_148);
  local_148 = (longdouble)0;
  TPZVec<long_double>::Resize(&local_a0,(long)*npoints,&local_148);
  local_148 = (longdouble)0;
  TPZVec<long_double>::Resize(&local_c0,(long)*npoints,&local_148);
  lVar15 = -(longdouble)1;
  if (alpha <= lVar15) {
    std::operator<<((ostream *)&std::cerr,
                    "\nJACOBI_COMPUTE - Fatal error!\n  -1.0 < ALPHA is required.\n");
  }
  else {
    if (lVar15 < beta) {
      local_80 = (_func_int **)&PTR__TPZVec_0183b530;
      uVar1 = *npoints;
      if (0 < (int)uVar1) {
        lVar16 = alpha + beta;
        iVar7 = 1;
        lVar9 = 0;
        do {
          lVar17 = (longdouble)0;
          if (beta - alpha != (longdouble)0 && lVar16 != (longdouble)0) {
            lVar17 = (longdouble)iVar7 + (longdouble)iVar7;
            lVar17 = ((beta - alpha) * lVar16) /
                     ((lVar17 + (longdouble)-2.0 + lVar16) * (lVar17 + lVar16));
            in_ST2 = in_ST1;
            local_10c = iVar7;
          }
          *(longdouble *)((long)local_a0.fStore + lVar9) = lVar17;
          if (lVar9 == 0) {
            *local_c0.fStore = (longdouble)0;
          }
          else {
            local_110 = iVar7 + -1;
            lVar17 = (longdouble)local_110;
            lVar18 = (longdouble)iVar7 + (longdouble)iVar7;
            lVar19 = lVar18 + (longdouble)-2.0 + lVar16;
            *(longdouble *)((long)local_c0.fStore + lVar9) =
                 ((lVar17 + lVar16) * (beta + lVar17) * (alpha + lVar17) * lVar17 * (longdouble)4.0)
                 / ((lVar18 + (longdouble)-3.0 + lVar16) *
                   lVar19 * lVar19 * (lVar18 + lVar15 + lVar16));
            in_ST1 = in_ST0;
            in_ST2 = in_ST0;
            local_114 = iVar7;
          }
          lVar9 = lVar9 + 0x10;
          iVar7 = iVar7 + 1;
          in_ST3 = in_ST2;
        } while ((ulong)uVar1 << 4 != lVar9);
      }
      local_108 = (longdouble)1 + alpha;
      local_c8 = Weight;
      dVar2 = gamma((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      dVar2 = gamma(dVar2);
      local_f8 = beta + alpha + (longdouble)2.0;
      dVar2 = gamma(dVar2);
      lVar15 = (longdouble)1;
      if (1 < *npoints) {
        lVar15 = (longdouble)1;
        lVar9 = 0;
        do {
          lVar15 = *(longdouble *)((long)local_c0.fStore + lVar9 + 0x10) * lVar15;
          lVar9 = lVar9 + 0x10;
        } while ((ulong)(uint)*npoints * 0x10 + -0x10 != lVar9);
      }
      exp2l(SUB84(dVar2,0));
      pp_Var3 = local_80;
      uVar1 = *npoints;
      lVar9 = (long)(int)uVar1;
      uVar4 = (ulong)uVar1;
      if (0 < lVar9) {
        local_128 = uVar1 - 8;
        local_118 = uVar1 * uVar1;
        local_54 = _DAT_014fd8a0;
        local_60 = _DAT_014fd8b0;
        local_6c = _DAT_014fd8c0;
        lVar16 = (longdouble)1;
        plVar5 = local_d0->fStore;
        local_120 = uVar1 - 8;
        lVar18 = (longdouble)(int)uVar1;
        local_3c = (((longdouble)8.0 * beta) / ((_DAT_014fd8e0 + beta) * (longdouble)local_118) +
                   lVar16) * ((_DAT_014fd8d0 * (longdouble)local_128) / (longdouble)(int)uVar1 +
                             lVar16) * (-(_DAT_014fd8b0 + _DAT_014fd8a0 * alpha) /
                                       (_DAT_014fd8c0 * alpha + lVar16));
        lVar17 = (longdouble)1;
        local_48 = (((ABS(alpha) * (longdouble)0.25 + lVar16) * _DAT_014fd930 * beta) / lVar18 +
                   lVar17) * (-(_DAT_014fd8f0 + alpha) /
                             ((_DAT_014fd900 * alpha + lVar16) * local_108)) *
                             (((_DAT_014fd920 * alpha + lVar16) *
                              _DAT_014fd910 * (longdouble)local_120) / lVar18 + lVar17);
        local_124 = uVar1 * uVar1;
        local_78 = (ulong)(local_124 + 4);
        lVar19 = alpha / lVar18;
        lVar25 = local_108 *
                 ((_DAT_014fd950 * lVar19) / lVar18 + _DAT_014fd940 / (longdouble)local_78);
        lVar16 = (longdouble)1;
        lVar17 = _DAT_014fd990 * lVar19 * (beta / lVar18) +
                 _DAT_014fd980 * lVar19 * lVar19 +
                 _DAT_014fd970 * (beta / lVar18) + _DAT_014fd960 * lVar19 + lVar17;
        local_11c = uVar1 - 8;
        local_e8 = (lVar16 / (((longdouble)8.0 * alpha) /
                              ((_DAT_014fd8e0 + alpha) * (longdouble)local_124) + lVar16)) *
                   (lVar16 / ((_DAT_014fd8d0 * (longdouble)local_11c) / lVar18 + lVar16)) *
                   ((_DAT_014fd8c0 * beta + lVar16) / (_DAT_014fd8b0 + _DAT_014fd8a0 * beta));
        local_12c = uVar1 - 4;
        local_dc = (lVar16 / ((alpha * (longdouble)20.0) /
                              ((alpha + (longdouble)7.5) * (longdouble)local_124) + lVar16)) *
                   (lVar16 / ((_DAT_014fd9d0 * (longdouble)local_12c) /
                              (_DAT_014fd9e0 * (longdouble)local_12c + lVar16) + lVar16)) *
                   ((_DAT_014fd9a0 * beta + lVar16) / (_DAT_014fd9c0 + _DAT_014fd9b0 * beta));
        lVar18 = (alpha - beta) / local_f8;
        local_f8 = (longdouble)CONCAT28(local_f8._8_2_,plVar5 + -2);
        local_108 = (longdouble)CONCAT28(local_108._8_2_,plVar5 + -4);
        plVar8 = local_c8->fStore;
        uVar6 = 1;
        lVar16 = (longdouble)0;
        do {
          lVar22 = (longdouble)1;
          iVar7 = (int)uVar6;
          lVar19 = lVar22;
          lVar23 = (lVar17 - lVar25) / lVar17;
          if (iVar7 != 1) {
            if (iVar7 == 3) {
              lVar20 = *plVar5 - lVar16;
              lVar23 = local_3c;
LAB_00b51431:
              lVar23 = lVar23 * lVar20;
            }
            else {
              if (iVar7 == 2) {
                lVar20 = lVar22 - lVar16;
                lVar23 = local_48;
                goto LAB_00b51431;
              }
              if ((long)(lVar9 - 1U) <= (long)uVar6) {
                if (uVar6 == (lVar9 - 1U & 0xffffffff)) {
                  lVar20 = lVar16 - plVar5[uVar6 - 3];
                  lVar23 = local_dc;
                }
                else {
                  lVar23 = lVar16;
                  if (uVar6 != uVar4) goto LAB_00b5143d;
                  lVar20 = lVar16 - plVar5[uVar6 - 3];
                  lVar23 = local_e8;
                }
                goto LAB_00b51431;
              }
              lVar16 = (plVar5 + -2)[uVar6] * (longdouble)3.0 + plVar5[uVar6 - 3] * (longdouble)-3.0
              ;
              lVar23 = (plVar5 + -4)[uVar6];
            }
            lVar23 = lVar23 + lVar16;
          }
LAB_00b5143d:
          do {
            lVar16 = lVar23;
            lVar19 = lVar19 * (longdouble)0.5;
            lVar23 = lVar16;
          } while (lVar22 < lVar19 + lVar22);
          uVar12 = 1;
          do {
            lVar20 = (longdouble)1;
            lVar23 = lVar18 + lVar16;
            lVar22 = lVar20;
            if (uVar1 != 1) {
              lVar10 = 0x10;
              lVar13 = uVar4 - 1;
              lVar21 = (longdouble)0;
              lVar24 = lVar20;
              lVar26 = lVar20;
              do {
                lVar22 = lVar23;
                lVar20 = lVar16 - *(longdouble *)((long)local_a0.fStore + lVar10);
                lVar23 = lVar20 * lVar22 - lVar24 * *(longdouble *)((long)local_c0.fStore + lVar10);
                lVar20 = (lVar20 * lVar26 + lVar22) -
                         *(longdouble *)((long)local_c0.fStore + lVar10) * lVar21;
                lVar10 = lVar10 + 0x10;
                lVar13 = lVar13 + -1;
                lVar21 = lVar26;
                lVar24 = lVar22;
                lVar26 = lVar20;
              } while (lVar13 != 0);
            }
            lVar16 = lVar16 - lVar23 / lVar20;
          } while (((lVar19 + lVar19) * (ABS(lVar16) + (longdouble)1) < ABS(lVar23 / lVar20)) &&
                  (bVar14 = uVar12 < 10, uVar12 = uVar12 + 1, bVar14));
          plVar5[uVar6 - 1] = lVar16;
          plVar8[uVar6 - 1] = (lVar15 * ((in_ST1 * in_ST0) / in_ST2) * in_ST3) / (lVar20 * lVar22);
          uVar6 = uVar6 + 1;
          local_134 = uVar1;
          local_130 = uVar1;
        } while (uVar6 != uVar1 + 1);
      }
      uVar6 = (ulong)(uint)((int)uVar1 / 2);
      if (1 < (int)uVar1) {
        plVar5 = local_d0->fStore;
        plVar8 = plVar5 + lVar9;
        uVar11 = uVar6;
        do {
          plVar8 = plVar8 + -1;
          lVar15 = *plVar5;
          *plVar5 = *plVar8;
          *plVar8 = lVar15;
          plVar5 = plVar5 + 1;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
      if (1 < (int)uVar1) {
        plVar5 = local_c8->fStore;
        plVar8 = plVar5 + uVar4;
        do {
          plVar8 = plVar8 + -1;
          lVar15 = *plVar5;
          *plVar5 = *plVar8;
          *plVar8 = lVar15;
          plVar5 = plVar5 + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      local_c0._vptr_TPZVec = local_80;
      if (local_c0.fStore != (longdouble *)0x0) {
        operator_delete__(local_c0.fStore);
      }
      local_a0._vptr_TPZVec = pp_Var3;
      if (local_a0.fStore != (longdouble *)0x0) {
        operator_delete__(local_a0.fStore);
      }
      return;
    }
    std::operator<<((ostream *)&std::cerr,
                    "\nJACOBI_COMPUTE - Fatal error!\n  -1.0 < BETA is required.\n");
  }
  exit(1);
}

Assistant:

void TPZGaussRule::ComputingGaussJacobiQuadrature(int *npoints,long double alpha, long double beta,TPZVec<long double> &Location,TPZVec<long double> &Weight) {
	// Computing number of points appropriated to the wished order = 2*npoints - 1. Note: If odd we need increment one point more
	long double an, bn;
	TPZVec<long double> b;
	TPZVec<long double> c;
	long double cc, delta, dp2;
	int i;
	long double p1, prod, r1, r2, r3, temp, x0 = 0.0;
	
	Location.Resize((*npoints),0.0L);
	Weight.Resize((*npoints),0.0L);
	
	b.Resize((*npoints),0.0L);
	c.Resize((*npoints),0.0L);
	
	//  This method permit only alpha > -1.0 and beta > -1.0
	if(alpha <= -1.0L) {
		std::cerr << "\nJACOBI_COMPUTE - Fatal error!\n  -1.0 < ALPHA is required.\n";
		std::exit ( 1 );
	}
	if(beta <= -1.0L) {
		std::cerr << "\nJACOBI_COMPUTE - Fatal error!\n  -1.0 < BETA is required.\n";
		std::exit ( 1 );
	}
	
	//  Set the recursion coefficients.
	for(i=1;i<=(*npoints);i++) {
		if(alpha + beta == 0.0L || beta - alpha == 0.0L) {
			b[i-1] = 0.0L;
		}
		else {
			b[i-1] = ( alpha + beta ) * ( beta - alpha ) / 
			( ( alpha + beta + ( 2.0L * ((long double)(i)) ) ) 
             * ( alpha + beta + ( 2.0L * ((long double)(i)) - 2.0L ) ) );
		}
		if(i==1) {
			c[i-1] = 0.0L;
		}
		else {
			c[i-1] = 4.0L * ( ((long double)(i)) - 1.0L ) * ( alpha + ( ((long double)(i)) - 1.0L ) ) * ( beta + ( ((long double)(i)) - 1.0L ) ) 
            * ( alpha + beta + ( ((long double)(i)) - 1.0L ) ) / 
            ( ( alpha + beta + ( 2.0L * ((long double)(i)) - 1.0L ) ) * (std::pow(alpha + beta + (2.0L*((long double)(i)) - 2.0L),2.0L)) 
			 * ( alpha + beta + ( 2.0L * ((long double)(i)) - 3.0L ) ) );
		}
	}
	
	delta = (gamma(alpha + 1.0L) * gamma(beta + 1.0L)) / gamma(alpha + beta + 2.0L);
	
	prod = 1.0L;
	for(i=2;i <= (*npoints);i++)
		prod = prod * c[i-1];
	cc = delta * std::pow( 2.0L, alpha + beta + 1.0L ) * prod;
	
	for(i=1;i<=(*npoints);i++) {
		if(i==1) {
			an = alpha / (long double)((*npoints));
			bn = beta / (long double)((*npoints));
			
			r1 = ( 1.0L + alpha ) * ( 2.78L / ( 4.0L + (long double)((*npoints)*(*npoints))) + 0.768L * an / (long double)((*npoints)));
			r2 = 1.0L + 1.48L * an + 0.96L * bn + 0.452L * an * an + 0.83L * an * bn;
			
			x0 = ( r2 - r1 ) / r2;
		}
		else if(i==2) {
			r1 = ( 4.1L + alpha ) / ( ( 1.0L + alpha ) * ( 1.0L + 0.156L * alpha ) );
			
			r2 = 1.0L + 0.06L * ((long double)((*npoints)) - 8.0L) * (1.0L + 0.12L * alpha) / (long double)((*npoints));
			r3 = 1.0L + 0.012L * beta * (1.0L + 0.25L * fabsl(alpha)) / (long double)((*npoints));
			
			x0 = x0 - r1*r2*r3*(1.0L - x0);
		}
		else if(i==3) {
			r1 = ( 1.67L + 0.28L * alpha ) / ( 1.0L + 0.37L * alpha );
			r2 = 1.0L + 0.22L * ( (long double)((*npoints)) - 8.0L) / (long double)((*npoints));
			r3 = 1.0L + 8.0L * beta / ( ( 6.28L + beta ) * (long double)((*npoints)*(*npoints)));
			
			x0 = x0 - r1 * r2 * r3 * ( Location[0] - x0 );
		}
		else if(i<(*npoints)-1) {
			x0 = 3.0L * Location[i-2] - 3.0L * Location[i-3] + Location[i-4];
		}
		else if(i==(*npoints)-1) {
			r1 = ( 1.0L + 0.235L * beta ) / (0.766L + 0.119L * beta);
			r2 = 1.0L / ( 1.0L + 0.639L * ((long double)((*npoints)) - 4.0L) 
						 / ( 1.0L + 0.71L * ((long double)((*npoints)) - 4.0L)));
			
			r3 = 1.0L / ( 1.0L + 20.0L * alpha / ( ( 7.5L + alpha ) * 
												  (long double)((*npoints)*(*npoints))));
			
			x0 = x0 + r1 * r2 * r3 * ( x0 - Location[i-3] );
		}
		else if(i==(*npoints)) {
			r1 = ( 1.0L + 0.37L * beta ) / ( 1.67L + 0.28L * beta );
			
			r2 = 1.0L / ( 1.0L + 0.22L * ( (long double)((*npoints)) - 8.0L ) 
						 / (long double)((*npoints)));
			
			r3 = 1.0L / ( 1.0L + 8.0L * alpha / 
						 ( ( 6.28L + alpha ) * (long double)((*npoints)*(*npoints))));
			
			x0 = x0 + r1 * r2 * r3 * ( x0 - Location[i-3] );
		}
		
		// Improving the root of the Jacobi polinomial
		long double d;
		long double precision;
		int itera, itera_max = 10;

		precision = machinePrecision();

		for(itera=1;itera<=itera_max;itera++) {
			d = JacobiPolinomial(x0,(*npoints),alpha,beta,b,c,&dp2,&p1);
			d /= dp2;
			x0 = x0 - d;
			if(fabsl(d) <= precision*(fabsl(x0) + 1.0L)) {
				break;
			}
		}
		Location[i-1] = x0;
		Weight[i-1] = cc/(dp2*p1);
	}

	// inverting the position of the points
	for(i=1;i<=(*npoints)/2;i++) {
		temp = Location[i-1];
		Location[i-1] = Location[(*npoints)-i];
		Location[(*npoints)-i] = temp;
	}
	// inverting the position of the weights
	for(i=1;i<=(*npoints)/2;i++) {
		temp = Weight[i-1];
		Weight[i-1] = Weight[(*npoints)-i];
		Weight[(*npoints)-i] = temp;
	}
}